

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::ThinDielectricMaterial> *material,ssize_t id)

{
  int __oflag;
  XMLWriter *in_RDX;
  long *in_RSI;
  XMLWriter *in_RDI;
  Vec3fa *in_stack_fffffffffffffec0;
  allocator *paVar1;
  char *in_stack_fffffffffffffec8;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  XMLWriter *local_38;
  
  local_38 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"material",&local_59);
  std::__cxx11::string::string(local_90,(string *)(*in_RSI + 0x30));
  open(in_RDI,(char *)local_58,(int)local_38,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  store(local_38,in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
  paVar1 = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"parameters",paVar1);
  open(in_RDI,(char *)local_b0,__oflag);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  store_parm(local_38,(char *)paVar1,in_stack_fffffffffffffec0);
  store_parm(local_38,(char *)paVar1,(float *)in_stack_fffffffffffffec0);
  store_parm(local_38,(char *)paVar1,(float *)in_stack_fffffffffffffec0);
  paVar1 = &local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"parameters",paVar1);
  close(in_RDI,(int)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"material",&local_101);
  close(in_RDI,(int)local_100);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  return;
}

Assistant:

void XMLWriter::store(Ref<ThinDielectricMaterial> material, ssize_t id)
  {
    open("material",id,material->name);
    store("code","ThinDielectric");
    open("parameters");
    store_parm("transmission",material->transmission);
    store_parm("eta",material->eta);
    store_parm("thickness",material->thickness);
    close("parameters");
    close("material");
  }